

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void P_SerializeSounds(FSerializer *arc)

{
  bool bVar1;
  int iVar2;
  FSerializer *this;
  BYTE order;
  char *name;
  
  S_SerializeSounds(arc);
  DSeqNode::SerializeSequences(arc);
  name = (char *)0x0;
  if (arc->w != (FWriter *)0x0) {
    iVar2 = S_GetMusic(&name);
    order = (BYTE)iVar2;
  }
  this = FSerializer::StringPtr(arc,"musicname",&name);
  FSerializer::operator()(this,"musicorder",&order);
  if ((arc->r != (FReader *)0x0) && (bVar1 = S_ChangeMusic(name,(uint)order,true,false), !bVar1)) {
    if ((level.cdtrack != 0) && (bVar1 = S_ChangeCDMusic(level.cdtrack,level.cdid,true), bVar1)) {
      return;
    }
    S_ChangeMusic(level.Music.Chars,level.musicorder,true,false);
  }
  return;
}

Assistant:

void P_SerializeSounds(FSerializer &arc)
{
	S_SerializeSounds(arc);
	DSeqNode::SerializeSequences (arc);
	const char *name = NULL;
	BYTE order;

	if (arc.isWriting())
	{
		order = S_GetMusic(&name);
	}
	arc.StringPtr("musicname", name)
		("musicorder", order);

	if (arc.isReading())
	{
		if (!S_ChangeMusic(name, order))
			if (level.cdtrack == 0 || !S_ChangeCDMusic(level.cdtrack, level.cdid))
				S_ChangeMusic(level.Music, level.musicorder);
	}
}